

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetAllocated
          (ArenaStringPtr *this,string *value,Arena *arena)

{
  string *str;
  string *new_value;
  Arena *pAStack_20;
  ScopedCheckPtrInvariants check;
  Arena *arena_local;
  string *value_local;
  ArenaStringPtr *this_local;
  
  pAStack_20 = arena;
  anon_unknown_8::ScopedCheckPtrInvariants::ScopedCheckPtrInvariants
            ((ScopedCheckPtrInvariants *)((long)&new_value + 7),&this->tagged_ptr_);
  Destroy(this);
  if (value == (string *)0x0) {
    InitDefault(this);
  }
  else {
    str = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)str,(string *)value);
    if (value != (string *)0x0) {
      std::__cxx11::string::~string((string *)value);
      operator_delete(value,0x20);
    }
    InitAllocated(this,str,pAStack_20);
  }
  return;
}

Assistant:

void ArenaStringPtr::SetAllocated(std::string* value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  // Release what we have first.
  Destroy();

  if (value == nullptr) {
    InitDefault();
  } else {
#ifndef NDEBUG
    // On debug builds, copy the string so the address differs.  delete will
    // fail if value was a stack-allocated temporary/etc., which would have
    // failed when arena ran its cleanup list.
    std::string* new_value = new std::string(std::move(*value));
    delete value;
    value = new_value;
#endif  // !NDEBUG
    InitAllocated(value, arena);
  }
}